

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O2

bool IsChildWithParentsTree(Package *package)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  __it;
  long lVar4;
  shared_ptr<const_CTransaction> *psVar5;
  pointer psVar6;
  long lVar7;
  __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
  _Var8;
  long in_FS_OFFSET;
  unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>
  parent_txids;
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_b0;
  insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
  local_68;
  value_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = IsChildWithParents(package);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_007c3ad5;
  }
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&local_b0);
  psVar6 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_68.iter.super__Node_iterator_base<uint256,_true>._M_cur =
       (_Node_iterator_base<uint256,_true>)(__node_type *)0x0;
  local_68.container =
       (unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_> *
       )&local_b0;
  for (; psVar6 != psVar1 + -1; psVar6 = psVar6 + 1) {
    peVar2 = (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
         *(undefined8 *)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
    local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
         *(undefined8 *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
    local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)
          ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
    local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)
          ((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
    std::
    insert_iterator<std::unordered_set<uint256,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<uint256>_>_>
    ::operator=(&local_68,&local_58);
  }
  __it._M_current =
       (package->
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (package->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + -1;
  lVar7 = (long)psVar5 - (long)__it._M_current;
  local_58.super_base_blob<256U>.m_data._M_elems._0_8_ = &local_b0;
  for (lVar4 = lVar7 >> 6; 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
            ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                          *)&local_58,__it);
    _Var8._M_current = __it._M_current;
    if (bVar3) goto LAB_007c3ac5;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
            ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                          *)&local_58,__it._M_current + 1);
    _Var8._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_007c3ac5;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
            ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                          *)&local_58,__it._M_current + 2);
    _Var8._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_007c3ac5;
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
            ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                          *)&local_58,__it._M_current + 3);
    _Var8._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_007c3ac5;
    __it._M_current = __it._M_current + 4;
    lVar7 = lVar7 + -0x40;
  }
  lVar7 = lVar7 >> 4;
  if (lVar7 == 1) {
LAB_007c3aaf:
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
            ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                          *)&local_58,__it);
    _Var8._M_current = __it._M_current;
    if (!bVar3) {
      _Var8._M_current = psVar5;
    }
  }
  else if (lVar7 == 2) {
LAB_007c3a9a:
    bVar3 = __gnu_cxx::__ops::
            _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
            ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                          *)&local_58,__it);
    _Var8._M_current = __it._M_current;
    if (!bVar3) {
      __it._M_current = __it._M_current + 1;
      goto LAB_007c3aaf;
    }
  }
  else {
    _Var8._M_current = psVar5;
    if ((lVar7 == 3) &&
       (bVar3 = __gnu_cxx::__ops::
                _Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::$_1>
                ::operator()((_Iter_negate<IsChildWithParentsTree(std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>const&)::__1>
                              *)&local_58,__it), _Var8._M_current = __it._M_current, !bVar3)) {
      __it._M_current = __it._M_current + 1;
      goto LAB_007c3a9a;
    }
  }
LAB_007c3ac5:
  bVar3 = _Var8._M_current == psVar5;
  std::
  _Hashtable<uint256,_uint256,_std::allocator<uint256>,_std::__detail::_Identity,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_b0);
LAB_007c3ad5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool IsChildWithParentsTree(const Package& package)
{
    if (!IsChildWithParents(package)) return false;
    std::unordered_set<uint256, SaltedTxidHasher> parent_txids;
    std::transform(package.cbegin(), package.cend() - 1, std::inserter(parent_txids, parent_txids.end()),
                   [](const auto& ptx) { return ptx->GetHash(); });
    // Each parent must not have an input who is one of the other parents.
    return std::all_of(package.cbegin(), package.cend() - 1, [&](const auto& ptx) {
        for (const auto& input : ptx->vin) {
            if (parent_txids.count(input.prevout.hash) > 0) return false;
        }
        return true;
    });
}